

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paf_score_graph.cpp
# Opt level: O1

void trt_pose::parse::paf_score_graph_out_khw
               (float *score_graph,int *topology,float *paf,int *counts,float *peaks,int K,int C,
               int H,int W,int M,int num_integral_samples)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  
  if (0 < K) {
    iVar3 = 0;
    lVar4 = 0;
    do {
      iVar1 = *(int *)((long)topology + lVar4 + 8);
      iVar2 = *(int *)((long)topology + lVar4 + 0xc);
      paf_score_graph_out_hw
                (score_graph + iVar3,paf + *(int *)((long)topology + lVar4) * W * H,
                 paf + *(int *)((long)topology + lVar4 + 4) * W * H,counts[iVar1],counts[iVar2],
                 peaks + M * 2 * iVar1,peaks + iVar2 * M * 2,H,W,M,num_integral_samples);
      lVar4 = lVar4 + 0x10;
      iVar3 = iVar3 + M * M;
    } while ((ulong)(uint)K << 4 != lVar4);
  }
  return;
}

Assistant:

void paf_score_graph_out_khw(float *score_graph,  // KxMxM
                             const int *topology, // Kx4
                             const float *paf,    // 2KxHxW
                             const int *counts,   // C
                             const float *peaks,  // CxMx2
                             const int K, const int C, const int H, const int W,
                             const int M, const int num_integral_samples) {
  for (int k = 0; k < K; k++) {
    float *score_graph_k = &score_graph[k * M * M];
    const int *tk = &topology[k * 4];
    const int paf_i_idx = tk[0];
    const int paf_j_idx = tk[1];
    const int cmap_a_idx = tk[2];
    const int cmap_b_idx = tk[3];
    const float *paf_i = &paf[paf_i_idx * H * W];
    const float *paf_j = &paf[paf_j_idx * H * W];

    const int counts_a = counts[cmap_a_idx];
    const int counts_b = counts[cmap_b_idx];
    const float *peaks_a = &peaks[cmap_a_idx * M * 2];
    const float *peaks_b = &peaks[cmap_b_idx * M * 2];

    paf_score_graph_out_hw(score_graph_k, paf_i, paf_j, counts_a, counts_b,
                           peaks_a, peaks_b, H, W, M, num_integral_samples);
  }
}